

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_light_object::save_v12(xr_light_object *this,xr_ini_writer *w)

{
  size_t sVar1;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  char *__buf_06;
  void *__buf_07;
  string asStack_58 [32];
  string local_38 [32];
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  std::__cxx11::string::string(local_38,(string *)&this->m_animation);
  sVar1 = 0;
  xr_ini_writer::write(w,0x1d1cf3,local_38,0);
  std::__cxx11::string::~string(local_38);
  xr_ini_writer::write(w,0x1d1d01,__buf,sVar1);
  xr_ini_writer::write(w,0x1d1d0e,__buf_00,sVar1);
  xr_ini_writer::write(w,0x1d1d1b,__buf_01,sVar1);
  xr_ini_writer::write(w,0x1d1d28,__buf_02,sVar1);
  xr_ini_writer::write(w,0x1d2c64,__buf_03,sVar1);
  xr_ini_writer::write(w,0x1d1d33,__buf_04,sVar1);
  std::__cxx11::string::string(asStack_58,(string *)&this->m_texture);
  sVar1 = 0;
  xr_ini_writer::write(w,0x1d1d38,asStack_58,0);
  std::__cxx11::string::~string(asStack_58);
  xr_ini_writer::write(w,0x1d1d47,(void *)(ulong)this->m_control,sVar1);
  xr_ini_writer::write(w,0x1d1d55,(void *)(ulong)this->m_flags,sVar1);
  xr_ini_writer::write(w,0x1d1d61,__buf_05,sVar1);
  xr_ini_writer::write
            (w,0x1d296f,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,sVar1);
  __buf_06 = "on";
  if (this->m_use_in_d3d == 0) {
    __buf_06 = "off";
  }
  sVar1 = 1;
  xr_ini_writer::write(w,0x1d1d67,__buf_06,1);
  xr_ini_writer::write(w,0x1d3f45,(void *)0x11,sVar1);
  xr_ini_writer::write(w,0x1d1d72,__buf_07,sVar1);
  return;
}

Assistant:

void xr_light_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("anim_ref_name", this->m_animation, false);

	w->write("attenuation0", this->m_attenuation_constant);
	w->write("attenuation1", this->m_attenuation_linear);
	w->write("attenuation2", this->m_attenuation_quadratic);
	w->write("brightness", this->m_brightness);
	w->write("color", this->m_color);
	w->write("cone", this->m_cone_angle);

	w->write("fallof_texture", this->m_texture, false);

	w->write("light_control", this->m_control);
	w->write("light_flags", this->m_flags);
	w->write("range", this->m_range);
	w->write("type", this->m_type);
	w->write("use_in_d3d", this->m_use_in_d3d ? "on" : "off");
	w->write("version", LIGHT_VERSION);
	w->write("virtual_size", 0.0f);
}